

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ConditionalBranchDirectiveSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConditionalBranchDirectiveSyntax,slang::syntax::ConditionalBranchDirectiveSyntax_const&>
          (BumpAllocator *this,ConditionalBranchDirectiveSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  SyntaxKind SVar7;
  undefined4 uVar8;
  ConditionalBranchDirectiveSyntax *pCVar9;
  
  pCVar9 = (ConditionalBranchDirectiveSyntax *)
           ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ConditionalBranchDirectiveSyntax *)this->endPtr < pCVar9 + 1) {
    pCVar9 = (ConditionalBranchDirectiveSyntax *)allocateSlow(this,0x68,8);
  }
  else {
    this->head->current = (byte *)(pCVar9 + 1);
  }
  (pCVar9->super_DirectiveSyntax).directive.info = (args->super_DirectiveSyntax).directive.info;
  SVar7 = (args->super_DirectiveSyntax).super_SyntaxNode.kind;
  uVar8 = *(undefined4 *)&(args->super_DirectiveSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_DirectiveSyntax).super_SyntaxNode.parent;
  TVar3 = (args->super_DirectiveSyntax).directive.kind;
  uVar4 = (args->super_DirectiveSyntax).directive.field_0x2;
  NVar5.raw = (args->super_DirectiveSyntax).directive.numFlags.raw;
  uVar6 = (args->super_DirectiveSyntax).directive.rawLen;
  (pCVar9->super_DirectiveSyntax).super_SyntaxNode.previewNode =
       (args->super_DirectiveSyntax).super_SyntaxNode.previewNode;
  (pCVar9->super_DirectiveSyntax).directive.kind = TVar3;
  (pCVar9->super_DirectiveSyntax).directive.field_0x2 = uVar4;
  (pCVar9->super_DirectiveSyntax).directive.numFlags = (NumericTokenFlags)NVar5.raw;
  (pCVar9->super_DirectiveSyntax).directive.rawLen = uVar6;
  (pCVar9->super_DirectiveSyntax).super_SyntaxNode.kind = SVar7;
  *(undefined4 *)&(pCVar9->super_DirectiveSyntax).super_SyntaxNode.field_0x4 = uVar8;
  (pCVar9->super_DirectiveSyntax).super_SyntaxNode.parent = pSVar1;
  (pCVar9->expr).ptr = (args->expr).ptr;
  (pCVar9->disabledTokens).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->disabledTokens).super_SyntaxListBase.super_SyntaxNode.previewNode;
  uVar8 = *(undefined4 *)&(args->disabledTokens).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->disabledTokens).super_SyntaxListBase.super_SyntaxNode.parent;
  (pCVar9->disabledTokens).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->disabledTokens).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pCVar9->disabledTokens).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar8;
  (pCVar9->disabledTokens).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pCVar9->disabledTokens).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00cb68b8;
  (pCVar9->disabledTokens).super_SyntaxListBase.childCount =
       (args->disabledTokens).super_SyntaxListBase.childCount;
  sVar2 = (args->disabledTokens).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent
          ._M_extent_value;
  (pCVar9->disabledTokens).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr =
       (args->disabledTokens).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr;
  (pCVar9->disabledTokens).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pCVar9->disabledTokens).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00cbee70;
  return pCVar9;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }